

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O1

int ProgramMain(int argc,char **argv)

{
  ValidateOptions *options_00;
  string_view *psVar1;
  long *plVar2;
  FileStream *pFVar3;
  string *header;
  ReadBinaryOptions *options_01;
  FileStream *this;
  pointer pcVar4;
  undefined8 uVar5;
  long lVar6;
  _Alloc_hider _Var7;
  Result RVar8;
  Result RVar9;
  int iVar10;
  char *pcVar11;
  size_type pos;
  long *plVar12;
  size_t sVar13;
  Callback *out_data;
  long *plVar14;
  char **unaff_RBX;
  uint uVar15;
  ulong unaff_RBP;
  char **ppcVar16;
  OptionParser *pOVar17;
  OptionParser *this_00;
  Module *out_module;
  pointer unaff_R12;
  undefined8 unaff_R13;
  Callback *unaff_R14;
  NullCallback *unaff_R15;
  string_view s;
  string_view filename;
  string_view sVar18;
  ValidateOptions options_1;
  string header_name;
  Errors errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  FileStream h_stream;
  ReadBinaryOptions options;
  OptionParser parser;
  
  pOVar17 = (OptionParser *)(ulong)(uint)argc;
  while( true ) {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(NullCallback **)((long)register0x00000020 + -0x10) = unaff_R15;
    *(Callback **)((long)register0x00000020 + -0x18) = unaff_R14;
    *(undefined8 *)((long)register0x00000020 + -0x20) = unaff_R13;
    *(pointer *)((long)register0x00000020 + -0x28) = unaff_R12;
    *(char ***)((long)register0x00000020 + -0x30) = unaff_RBX;
    unaff_RBP = (ulong)pOVar17 & 0xffffffff;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141c97;
    wabt::InitStdio();
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141cb5;
    wabt::OptionParser::OptionParser
              ((OptionParser *)((long)register0x00000020 + -0x3a8),"wasm2c",
               "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
              );
    *(undefined8 *)
     &(((NullCallback *)((long)register0x00000020 + -0x4a8))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 0;
    *(code **)((long)register0x00000020 + -0x490) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:61:72)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x498) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:61:72)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141cf5;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x3a8),'v',"verbose",
               "Use multiple times for more info",
               (NullCallback *)((long)register0x00000020 + -0x4a8));
    if (*(code **)((long)register0x00000020 + -0x498) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141d0d;
      (**(code **)((long)register0x00000020 + -0x498))
                ((undefined1 *)((long)register0x00000020 + -0x4a8),
                 (undefined1 *)((long)register0x00000020 + -0x4a8),3);
    }
    *(undefined8 *)
     &(((Callback *)((long)register0x00000020 + -0x4a8))->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 0;
    *(code **)((long)register0x00000020 + -0x490) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:68:7)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x498) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:68:7)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141d59;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x3a8),'o',"output","FILENAME",
               "Output file for the generated C source file, by default use stdout",
               (Callback *)((long)register0x00000020 + -0x4a8));
    if (*(code **)((long)register0x00000020 + -0x498) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141d71;
      (**(code **)((long)register0x00000020 + -0x498))
                ((undefined1 *)((long)register0x00000020 + -0x4a8),
                 (undefined1 *)((long)register0x00000020 + -0x4a8),3);
    }
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141d88;
    wabt::Features::AddOptions(&s_features,(OptionParser *)((long)register0x00000020 + -0x3a8));
    unaff_R15 = (NullCallback *)((long)register0x00000020 + -0x4a8);
    *(undefined8 *)&(unaff_R15->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 0;
    *(code **)((long)register0x00000020 + -0x490) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:74:20)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x498) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:74:20)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141dc3;
    wabt::OptionParser::AddOption
              ((OptionParser *)((long)register0x00000020 + -0x3a8),"no-debug-names",
               "Ignore debug names in the binary file",unaff_R15);
    if (*(code **)((long)register0x00000020 + -0x498) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141ddb;
      (**(code **)((long)register0x00000020 + -0x498))
                ((undefined1 *)((long)register0x00000020 + -0x4a8),
                 (undefined1 *)((long)register0x00000020 + -0x4a8),3);
    }
    unaff_R12 = (pointer)((long)register0x00000020 + -0x498);
    *(pointer *)((long)register0x00000020 + -0x4a8) = unaff_R12;
    unaff_R12[0] = 'f';
    unaff_R12[1] = 'i';
    unaff_R12[2] = 'l';
    unaff_R12[3] = 'e';
    unaff_R12[4] = 'n';
    unaff_R12[5] = 'a';
    unaff_R12[6] = 'm';
    unaff_R12[7] = 'e';
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 8;
    *(undefined1 *)((long)register0x00000020 + -0x490) = 0;
    unaff_R14 = (Callback *)((long)register0x00000020 + -0x408);
    *(undefined8 *)&(unaff_R14->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)register0x00000020 + -0x400) = 0;
    *(code **)((long)register0x00000020 + -0x3f0) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:76:22)>
         ::_M_invoke;
    *(code **)((long)register0x00000020 + -0x3f8) =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:76:22)>
         ::_M_manager;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141e3e;
    out_data = unaff_R14;
    wabt::OptionParser::AddArgument
              ((OptionParser *)((long)register0x00000020 + -0x3a8),
               (string *)((long)register0x00000020 + -0x4a8),One,unaff_R14);
    if (*(code **)((long)register0x00000020 + -0x3f8) != (code *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141e59;
      (**(code **)((long)register0x00000020 + -0x3f8))
                ((undefined1 *)((long)register0x00000020 + -0x408),
                 (undefined1 *)((long)register0x00000020 + -0x408),3);
    }
    if (*(pointer *)((long)register0x00000020 + -0x4a8) != unaff_R12) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141e68;
      operator_delete(*(pointer *)((long)register0x00000020 + -0x4a8));
    }
    this_00 = (OptionParser *)((long)register0x00000020 + -0x3a8);
    ppcVar16 = (char **)((ulong)pOVar17 & 0xffffffff);
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141e7a;
    wabt::OptionParser::Parse(this_00,(int)pOVar17,argv);
    if (((((s_features.exceptions_enabled_ == false) &&
          (s_features.mutable_globals_enabled_ != false)) &&
         (s_features.sat_float_to_int_enabled_ == false)) &&
        ((((s_features.sign_extension_enabled_ == false && (s_features.simd_enabled_ == false)) &&
          ((s_features.threads_enabled_ == false &&
           ((s_features.multi_value_enabled_ == false && (s_features.tail_call_enabled_ == false))))
          )) && (s_features.bulk_memory_enabled_ == false)))) &&
       (((s_features.reference_types_enabled_ == false && (s_features.annotations_enabled_ == false)
         ) && (s_features.gc_enabled_ == false)))) break;
    *(code **)((long)register0x00000020 + -0x4c0) = main;
    ProgramMain();
    unaff_RBX = argv;
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x4b8);
    argv = ppcVar16;
    pOVar17 = this_00;
  }
  if (*(code **)((long)register0x00000020 + -0x328) != (code *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141f35;
    (**(code **)((long)register0x00000020 + -0x328))
              ((undefined1 *)((long)register0x00000020 + -0x338),
               (undefined1 *)((long)register0x00000020 + -0x338),3);
  }
  *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141f42;
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             ((long)register0x00000020 + -0x350));
  *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141f52;
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             ((long)register0x00000020 + -0x368));
  if (*(undefined1 **)((long)register0x00000020 + -0x388) !=
      (undefined1 *)((long)register0x00000020 + -0x378)) {
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141f68;
    operator_delete(*(undefined1 **)((long)register0x00000020 + -0x388));
  }
  if (*(undefined1 **)((long)register0x00000020 + -0x3a8) !=
      (undefined1 *)((long)register0x00000020 + -0x398)) {
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141f7e;
    operator_delete(*(undefined1 **)((long)register0x00000020 + -0x3a8));
  }
  _Var7._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
  *(undefined8 *)((long)register0x00000020 + -0x428) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x420) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x418) = 0;
  *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141fa3;
  pcVar11 = (char *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x141fb1;
  sVar18.size_ = (size_type)((long)register0x00000020 + -0x428);
  sVar18.data_ = pcVar11;
  RVar8 = wabt::ReadFile((wabt *)_Var7._M_p,sVar18,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_data);
  uVar15 = 1;
  if (RVar8.enum_ == Ok) {
    (((Errors *)((long)register0x00000020 + -0x448))->
    super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    *(undefined8 *)((long)register0x00000020 + -0x440) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x438) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x39c) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x394) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x3a8) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x3a0) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x388) =
         (undefined1 *)((long)register0x00000020 + -0x378);
    *(undefined8 *)((long)register0x00000020 + -0x380) = 0;
    *(undefined1 *)((long)register0x00000020 + -0x378) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x368) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x360) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x358) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x350) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x34c) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x344) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14200b;
    memset((undefined1 *)((long)register0x00000020 + -0x338),0,0x108);
    *(undefined1 **)((long)register0x00000020 + -0x230) =
         (undefined1 *)((long)register0x00000020 + -0x200);
    *(undefined8 *)((long)register0x00000020 + -0x228) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x220) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x218) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x210) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x208) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x200) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x1f8) =
         (undefined1 *)((long)register0x00000020 + -0x1c8);
    *(undefined8 *)((long)register0x00000020 + -0x1f0) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x1e8) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x1e0) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x1d8) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x1d0) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x1c8) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x1c0) =
         (undefined1 *)((long)register0x00000020 + -400);
    *(undefined8 *)((long)register0x00000020 + -0x1b8) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x1b0) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x1a8) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x1a0) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x198) = 0;
    *(undefined8 *)((long)register0x00000020 + -400) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x188) =
         (undefined1 *)((long)register0x00000020 + -0x158);
    *(undefined8 *)((long)register0x00000020 + -0x180) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x178) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x170) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x168) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x160) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x158) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x150) =
         (undefined1 *)((long)register0x00000020 + -0x120);
    *(undefined8 *)((long)register0x00000020 + -0x148) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x140) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x138) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x130) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x128) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x120) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x118) =
         (undefined1 *)((long)register0x00000020 + -0xe8);
    *(undefined8 *)((long)register0x00000020 + -0x110) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x108) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x100) = 0;
    *(undefined4 *)((long)register0x00000020 + -0xf8) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0xf0) = 0;
    *(undefined8 *)((long)register0x00000020 + -0xe8) = 0;
    *(undefined1 **)((long)register0x00000020 + -0xe0) =
         (undefined1 *)((long)register0x00000020 + -0xb0);
    *(undefined8 *)((long)register0x00000020 + -0xd8) = 1;
    *(undefined8 *)((long)register0x00000020 + -0xd0) = 0;
    *(undefined8 *)((long)register0x00000020 + -200) = 0;
    *(undefined4 *)((long)register0x00000020 + -0xc0) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0xb8) = 0;
    *(undefined8 *)((long)register0x00000020 + -0xb0) = 0;
    *(undefined1 **)((long)register0x00000020 + -0xa8) =
         (undefined1 *)((long)register0x00000020 + -0x78);
    *(undefined8 *)((long)register0x00000020 + -0xa0) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x98) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x90) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x88) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x80) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x78) = 0;
    *(undefined1 **)((long)register0x00000020 + -0x70) =
         (undefined1 *)((long)register0x00000020 + -0x40);
    *(undefined8 *)((long)register0x00000020 + -0x68) = 1;
    *(undefined8 *)((long)register0x00000020 + -0x60) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x58) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x50) = 0x3f800000;
    *(undefined8 *)((long)register0x00000020 + -0x48) = 0;
    *(undefined8 *)((long)register0x00000020 + -0x40) = 0;
    options_01 = (ReadBinaryOptions *)((long)register0x00000020 + -0x3c8);
    (options_01->features).exceptions_enabled_ = s_features.exceptions_enabled_;
    (options_01->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    (options_01->features).sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    (options_01->features).sign_extension_enabled_ = s_features.sign_extension_enabled_;
    (options_01->features).simd_enabled_ = s_features.simd_enabled_;
    (options_01->features).threads_enabled_ = s_features.threads_enabled_;
    (options_01->features).multi_value_enabled_ = s_features.multi_value_enabled_;
    (options_01->features).tail_call_enabled_ = s_features.tail_call_enabled_;
    *(undefined4 *)((long)register0x00000020 + -0x3c0) = s_features._8_4_;
    ((__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true> *)
    ((long)register0x00000020 + -0x3b8))->
    super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_> =
         (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    *(byte *)((long)register0x00000020 + -0x3b0) = s_read_debug_names ^ 1;
    *(undefined2 *)((long)register0x00000020 + -0x3af) = 0x101;
    out_module = (Module *)((long)register0x00000020 + -0x3a8);
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142168;
    RVar8 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,
                               *(void **)((long)register0x00000020 + -0x428),
                               *(long *)((long)register0x00000020 + -0x420) -
                               (long)*(void **)((long)register0x00000020 + -0x428),options_01,
                               (Errors *)((long)register0x00000020 + -0x448),out_module);
    if (RVar8.enum_ == Ok) {
      options_00 = (ValidateOptions *)((long)register0x00000020 + -0x4a8);
      *(undefined4 *)((long)register0x00000020 + -0x4a0) = s_features._8_4_;
      (options_00->features).exceptions_enabled_ = s_features.exceptions_enabled_;
      (options_00->features).mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      (options_00->features).sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
      (options_00->features).sign_extension_enabled_ = s_features.sign_extension_enabled_;
      (options_00->features).simd_enabled_ = s_features.simd_enabled_;
      (options_00->features).threads_enabled_ = s_features.threads_enabled_;
      (options_00->features).multi_value_enabled_ = s_features.multi_value_enabled_;
      (options_00->features).tail_call_enabled_ = s_features.tail_call_enabled_;
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14219f;
      RVar8 = wabt::ValidateModule
                        ((Module *)((long)register0x00000020 + -0x3a8),
                         (Errors *)((long)register0x00000020 + -0x448),options_00);
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1421ab;
      RVar9 = wabt::GenerateNames((Module *)((long)register0x00000020 + -0x3a8),None);
      if (RVar9.enum_ == Error || RVar8.enum_ == Error) {
        RVar8.enum_ = (Enum)(RVar9.enum_ == Error || RVar8.enum_ == Error);
      }
      else {
        *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1421d0;
        wabt::ApplyNames((Module *)((long)register0x00000020 + -0x3a8));
        if (s_outfile_abi_cxx11_._M_string_length == 0) {
          pFVar3 = (FileStream *)((long)register0x00000020 + -0x4a8);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1422c3;
          wabt::FileStream::FileStream(pFVar3,_stdout,(Stream *)0x0);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1422e4;
          RVar8 = wabt::WriteC((wabt *)pFVar3,(Stream *)pFVar3,(Stream *)"wasm.h",
                               (char *)((long)register0x00000020 + -0x3a8),
                               (Module *)&s_write_c_options,(WriteCOptions *)out_module);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1422ee;
          wabt::FileStream::~FileStream(pFVar3);
        }
        else {
          psVar1 = (string_view *)((long)register0x00000020 + -0x468);
          psVar1->data_ = s_outfile_abi_cxx11_._M_dataplus._M_p;
          *(size_type *)((long)register0x00000020 + -0x460) = s_outfile_abi_cxx11_._M_string_length;
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142207;
          pos = wabt::string_view::find_last_of(psVar1,'.',0xffffffffffffffff);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142219;
          sVar18 = wabt::string_view::substr(psVar1,pos,0xffffffffffffffff);
          *(char **)((long)register0x00000020 + -0x408) = psVar1->data_;
          *(undefined8 *)((long)register0x00000020 + -0x400) =
               *(undefined8 *)((long)register0x00000020 + -0x460);
          *(string_view *)((long)register0x00000020 + -0x4a8) = sVar18;
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142245;
          s.size_ = 2;
          s.data_ = ".c";
          iVar10 = wabt::string_view::compare((string_view *)((long)register0x00000020 + -0x4a8),s);
          if (iVar10 == 0) {
            *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142259;
            wabt::string_view::remove_suffix
                      ((string_view *)((long)register0x00000020 + -0x408),sVar18.size_);
          }
          psVar1 = (string_view *)((long)register0x00000020 + -0x408);
          uVar5 = *(undefined8 *)((long)register0x00000020 + -0x400);
          psVar1->data_ = psVar1->data_;
          *(undefined8 *)((long)register0x00000020 + -0x400) = uVar5;
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142274;
          wabt::string_view::to_string_abi_cxx11_
                    ((string *)((long)register0x00000020 + -0x4a8),psVar1);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142283;
          plVar12 = (long *)std::__cxx11::string::append
                                      ((char *)((long)register0x00000020 + -0x4a8));
          plVar2 = (long *)((long)register0x00000020 + -0x458);
          *(long **)((long)register0x00000020 + -0x468) = plVar2;
          plVar14 = plVar12 + 2;
          if ((long *)*plVar12 == plVar14) {
            lVar6 = plVar12[3];
            *plVar2 = *plVar14;
            *(long *)((long)register0x00000020 + -0x450) = lVar6;
          }
          else {
            *(long **)((long)register0x00000020 + -0x468) = (long *)*plVar12;
            *(long *)((long)register0x00000020 + -0x458) = *plVar14;
          }
          *(long *)((long)register0x00000020 + -0x460) = plVar12[1];
          *plVar12 = (long)plVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          if (*(pointer *)((long)register0x00000020 + -0x4a8) != unaff_R12) {
            *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142322;
            operator_delete(*(pointer *)((long)register0x00000020 + -0x4a8));
          }
          _Var7._M_p = s_outfile_abi_cxx11_._M_dataplus._M_p;
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142331;
          sVar13 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
          pFVar3 = (FileStream *)((long)register0x00000020 + -0x4a8);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142346;
          filename.size_ = sVar13;
          filename.data_ = _Var7._M_p;
          wabt::FileStream::FileStream(pFVar3,filename,(Stream *)0x0);
          this = (FileStream *)((long)register0x00000020 + -0x408);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142362;
          wabt::FileStream::FileStream
                    (this,*(string_view *)((long)register0x00000020 + -0x468),(Stream *)0x0);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142381;
          RVar8 = wabt::WriteC((wabt *)pFVar3,(Stream *)this,
                               *(Stream **)((long)register0x00000020 + -0x468),
                               (char *)((long)register0x00000020 + -0x3a8),
                               (Module *)&s_write_c_options,(WriteCOptions *)out_module);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14238b;
          wabt::FileStream::~FileStream(this);
          *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142393;
          wabt::FileStream::~FileStream(pFVar3);
          if (*(long **)((long)register0x00000020 + -0x468) != plVar2) {
            *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1423a2;
            operator_delete(*(long **)((long)register0x00000020 + -0x468));
          }
        }
      }
    }
    header = (string *)((long)register0x00000020 + -0x4a8);
    (header->_M_dataplus)._M_p = unaff_R12;
    *(undefined8 *)((long)register0x00000020 + -0x4a0) = 0;
    *(undefined1 *)((long)register0x00000020 + -0x498) = 0;
    *(undefined4 *)((long)register0x00000020 + -0x4b8) = 0x50;
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1423df;
    wabt::FormatErrorsToFile
              ((Errors *)((long)register0x00000020 + -0x448),Binary,(LexerSourceLineFinder *)0x0,
               _stderr,header,Never,*(int *)((long)register0x00000020 + -0x4b8));
    pcVar4 = (header->_M_dataplus)._M_p;
    if (pcVar4 != unaff_R12) {
      *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1423ec;
      operator_delete(pcVar4);
    }
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x1423f9;
    wabt::Module::~Module((Module *)((long)register0x00000020 + -0x3a8));
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x142403;
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               ((long)register0x00000020 + -0x448));
    uVar15 = (uint)(RVar8.enum_ != Ok);
  }
  if (*(void **)((long)register0x00000020 + -0x428) != (void *)0x0) {
    *(undefined8 *)((long)register0x00000020 + -0x4c0) = 0x14241d;
    operator_delete(*(void **)((long)register0x00000020 + -0x428));
  }
  return uVar15;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    const bool kFailOnCustomSectionError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              kFailOnCustomSectionError);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
        result |= GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        if (!s_outfile.empty()) {
          std::string header_name =
              strip_extension(s_outfile).to_string() + ".h";
          FileStream c_stream(s_outfile.c_str());
          FileStream h_stream(header_name);
          result = WriteC(&c_stream, &h_stream, header_name.c_str(), &module,
                          s_write_c_options);
        } else {
          FileStream stream(stdout);
          result =
              WriteC(&stream, &stream, "wasm.h", &module, s_write_c_options);
        }
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}